

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureCubeFormatCase::init(TextureCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *str;
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *poVar3;
  MessageBuilder *pMVar4;
  TextureCube *this_00;
  int face;
  long lVar5;
  long lVar6;
  TextureFormatInfo spec;
  TextureFormat fmt;
  Vec4 gMin;
  ostringstream fmtName;
  undefined1 auStack_3a8 [16];
  Vec4 local_398 [3];
  undefined1 local_360 [4];
  float fStack_35c;
  float local_358;
  float fStack_354;
  TextureFormat local_340;
  LogGradientFmt local_338;
  undefined1 local_328 [8];
  _func_int **local_320;
  ostream local_1a8;
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_340 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::getTextureFormatInfo((TextureFormatInfo *)auStack_3a8,&local_340);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (this->m_dataType == 0) {
    local_328 = (undefined1  [8])glu::getTextureFormatName;
    local_320 = (_func_int **)CONCAT44(local_320._4_4_,this->m_format);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,&local_1a8);
  }
  else {
    local_328 = (undefined1  [8])glu::getTextureFormatName;
    local_320 = (_func_int **)CONCAT44(local_320._4_4_,this->m_format);
    poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,&local_1a8);
    poVar3 = std::operator<<(poVar3,", ");
    local_358 = (float)this->m_dataType;
    local_360 = (undefined1  [4])0x154f98f;
    fStack_35c = 0.0;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_360,poVar3);
  }
  local_328 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
  std::operator<<((ostream *)&local_320,"Cube map texture, ");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&local_320,(string *)local_360);
  std::operator<<((ostream *)&local_320,", ");
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_328,&this->m_width);
  std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"x");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_height);
  str = &pMVar4->m_str;
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>,",\n  fill with ");
  local_338.valueMax = local_398;
  local_338.valueMin = (Vec4 *)auStack_3a8;
  glu::TextureTestUtil::operator<<
            (&str->super_basic_ostream<char,_std::char_traits<char>_>,&local_338);
  std::operator<<(&str->super_basic_ostream<char,_std::char_traits<char>_>," gradient");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_360);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,this->m_width);
  }
  else {
    this_00 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_00,this->m_renderCtx,this->m_format,dataType,this->m_width);
  }
  this->m_texture = this_00;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_328);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_360);
    local_328 = (undefined1  [8])auStack_3a8._0_8_;
    local_320 = (_func_int **)auStack_3a8._8_8_;
    local_360 = (undefined1  [4])local_398[0].m_data[0];
    fStack_35c = (float)local_398[0].m_data._4_8_;
    local_358 = SUB84(local_398[0].m_data._4_8_,4);
    fStack_354 = local_398[0].m_data[3];
    tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)lVar5,0);
    tcu::fillWithComponentGradients
              (*(PixelBufferAccess **)
                ((long)&(this->m_texture->m_refTexture).m_access[0].
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6),
               (Vector<float,_4> *)local_328,(Vector<float,_4> *)local_360);
    lVar6 = lVar6 + 0x18;
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return iVar2;
}

Assistant:

void TextureCubeFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= glu::mapGLTransferFormat(m_format, m_dataType);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << getTextureFormatStr(m_format) << ", " << getTypeStr(m_dataType);
	else
		fmtName << getTextureFormatStr(m_format);

	log << TestLog::Message << "Cube map texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	DE_ASSERT(m_width == m_height);
	m_texture = m_dataType != GL_NONE
			  ? new TextureCube(m_renderCtx, m_format, m_dataType, m_width)	// Implicit internal format.
		      : new TextureCube(m_renderCtx, m_format, m_width);				// Explicit internal format.

	// Fill level 0.
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		tcu::Vec4 gMin, gMax;

		switch (face)
		{
			case 0: gMin = spec.valueMin.swizzle(0, 1, 2, 3); gMax = spec.valueMax.swizzle(0, 1, 2, 3); break;
			case 1: gMin = spec.valueMin.swizzle(2, 1, 0, 3); gMax = spec.valueMax.swizzle(2, 1, 0, 3); break;
			case 2: gMin = spec.valueMin.swizzle(1, 2, 0, 3); gMax = spec.valueMax.swizzle(1, 2, 0, 3); break;
			case 3: gMin = spec.valueMax.swizzle(0, 1, 2, 3); gMax = spec.valueMin.swizzle(0, 1, 2, 3); break;
			case 4: gMin = spec.valueMax.swizzle(2, 1, 0, 3); gMax = spec.valueMin.swizzle(2, 1, 0, 3); break;
			case 5: gMin = spec.valueMax.swizzle(1, 2, 0, 3); gMax = spec.valueMin.swizzle(1, 2, 0, 3); break;
			default:
				DE_ASSERT(false);
		}

		m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gMin, gMax);
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}